

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O0

string * __thiscall Entity::toString_abi_cxx11_(Entity *this)

{
  string *this_00;
  allocator local_11;
  Entity *local_10;
  Entity *this_local;
  
  local_10 = this;
  this_00 = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,"Not implemented",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  return this_00;
}

Assistant:

string* Entity::toString() {
    return new string("Not implemented");
}